

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O1

Status __thiscall cmsys::Directory::Load(Directory *this,string *name,string *errorMessage)

{
  int *piVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char *__s;
  Status SVar3;
  allocator<char> local_49;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::resize((ulong)&this->Internal->Path,'\0');
  std::
  vector<cmsys::DirectoryInternals::FileData,_std::allocator<cmsys::DirectoryInternals::FileData>_>
  ::_M_erase_at_end(&this->Internal->Files,
                    (this->Internal->Files).
                    super__Vector_base<cmsys::DirectoryInternals::FileData,_std::allocator<cmsys::DirectoryInternals::FileData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  piVar1 = __errno_location();
  *piVar1 = 0;
  __dirp = opendir((name->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    *piVar1 = 0;
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      std::
      vector<cmsys::DirectoryInternals::FileData,std::allocator<cmsys::DirectoryInternals::FileData>>
      ::emplace_back<char(&)[256]>
                ((vector<cmsys::DirectoryInternals::FileData,std::allocator<cmsys::DirectoryInternals::FileData>>
                  *)this->Internal,&pdVar2->d_name);
    }
    if (*piVar1 == 0) {
      std::__cxx11::string::_M_assign((string *)&this->Internal->Path);
      closedir(__dirp);
      SVar3.Kind_ = Success;
      SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
      return SVar3;
    }
  }
  if (errorMessage != (string *)0x0) {
    __s = strerror(*piVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,&local_49);
    std::__cxx11::string::operator=((string *)errorMessage,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  SVar3 = Status::POSIX_errno();
  return SVar3;
}

Assistant:

Status Directory::Load(std::string const& name, std::string* errorMessage)
{
  this->Clear();

  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  errno = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    this->Internal->Files.emplace_back(d->d_name);
  }
  if (errno != 0) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  this->Internal->Path = name;
  closedir(dir);
  return Status::Success();
}